

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_183::Flower::connectDuringFlow(Flower *this,Location from,Location to)

{
  LocationIndex index;
  size_type sVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  PossibleContents *newContents;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *targets;
  IndexLink local_58;
  IndexLink newIndexLink;
  LocationLink newLink;
  Flower *this_local;
  
  newIndexLink = (IndexLink)
                 from.
                 super__Variant_base<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                 .
                 super__Move_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                 .
                 super__Copy_assign_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                 .
                 super__Move_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                 .
                 super__Copy_ctor_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                 .
                 super__Variant_storage_alias<wasm::ExpressionLocation,_wasm::ParamLocation,_wasm::LocalLocation,_wasm::ResultLocation,_wasm::GlobalLocation,_wasm::SignatureParamLocation,_wasm::SignatureResultLocation,_wasm::DataLocation,_wasm::TagLocation,_wasm::CaughtExnRefLocation,_wasm::NullLocation,_wasm::ConeReadLocation>
                 ._M_u._M_first._M_storage.expr;
  local_58 = getIndexes(this,(LocationLink *)&newIndexLink);
  sVar1 = std::
          unordered_set<wasm::(anonymous_namespace)::Link<unsigned_int>,_std::hash<wasm::(anonymous_namespace)::Link<unsigned_int>_>,_std::equal_to<wasm::(anonymous_namespace)::Link<unsigned_int>_>,_std::allocator<wasm::(anonymous_namespace)::Link<unsigned_int>_>_>
          ::count(&this->links,&local_58);
  if (sVar1 == 0) {
    std::
    unordered_set<wasm::(anonymous_namespace)::Link<unsigned_int>,_std::hash<wasm::(anonymous_namespace)::Link<unsigned_int>_>,_std::equal_to<wasm::(anonymous_namespace)::Link<unsigned_int>_>,_std::allocator<wasm::(anonymous_namespace)::Link<unsigned_int>_>_>
    ::insert(&this->links,&local_58);
    this_00 = getTargets(this,local_58.from);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_00,&local_58.to);
    wasm::(anonymous_namespace)::
    disallowDuplicates<std::vector<unsigned_int,std::allocator<unsigned_int>>>(this_00);
    index = getIndex(this,&from);
    newContents = getContents(this,index);
    updateContents(this,&to,newContents);
  }
  return;
}

Assistant:

void Flower::connectDuringFlow(Location from, Location to) {
  auto newLink = LocationLink{from, to};
  auto newIndexLink = getIndexes(newLink);
  if (links.count(newIndexLink) == 0) {
    // This is a new link. Add it to the known links.
    links.insert(newIndexLink);

    // Add it to the |targets| vector.
    auto& targets = getTargets(newIndexLink.from);
    targets.push_back(newIndexLink.to);
#ifndef NDEBUG
    disallowDuplicates(targets);
#endif

    // In addition to adding the link, which will ensure new contents appearing
    // later will be sent along, we also update with the current contents.
    updateContents(to, getContents(getIndex(from)));
  }
}